

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

bool __thiscall
Remapper::remap_stage_input(Remapper *this,D3DStageIO *d3d_input,VulkanStageIO *vk_input)

{
  dxil_spv_bool dVar1;
  undefined1 local_4c [8];
  dxil_spv_vulkan_shader_stage_io c_vk_input;
  dxil_spv_d3d_shader_stage_io c_input;
  VulkanStageIO *vk_input_local;
  D3DStageIO *d3d_input_local;
  Remapper *this_local;
  
  c_vk_input._4_8_ = d3d_input->semantic;
  local_4c._0_4_ = vk_input->location;
  local_4c._4_4_ = vk_input->component;
  c_vk_input.location = vk_input->flags;
  if (this->stage_input_remapper == (dxil_spv_shader_stage_io_remapper_cb)0x0) {
    this_local._7_1_ = true;
  }
  else {
    dVar1 = (*this->stage_input_remapper)
                      (this->stage_input_userdata,
                       (dxil_spv_d3d_shader_stage_io *)&c_vk_input.component,
                       (dxil_spv_vulkan_shader_stage_io *)local_4c);
    if (dVar1 == '\x01') {
      vk_input->location = local_4c._0_4_;
      vk_input->component = local_4c._4_4_;
      vk_input->flags = c_vk_input.location;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool remap_stage_input(const D3DStageIO &d3d_input, VulkanStageIO &vk_input) override
	{
		dxil_spv_d3d_shader_stage_io c_input = { d3d_input.semantic, d3d_input.semantic_index };
		dxil_spv_vulkan_shader_stage_io c_vk_input = { vk_input.location, vk_input.component, vk_input.flags };

		if (stage_input_remapper)
		{
			if (stage_input_remapper(stage_input_userdata, &c_input, &c_vk_input) == DXIL_SPV_TRUE)
			{
				vk_input.location = c_vk_input.location;
				vk_input.component = c_vk_input.component;
				vk_input.flags = c_vk_input.flags;
				return true;
			}
			else
				return false;
		}
		else
		{
			return true;
		}
	}